

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O1

json_t * json_object(void)

{
  int iVar1;
  json_t *ptr;
  
  ptr = (json_t *)jsonp_malloc(0x50);
  if (ptr != (json_t *)0x0) {
    if (hashtable_seed == 0) {
      json_object_seed(0);
    }
    ptr->type = JSON_OBJECT;
    ptr->refcount = 1;
    iVar1 = hashtable_init((hashtable_t *)(ptr + 1));
    if (iVar1 == 0) {
      *(undefined4 *)&ptr[4].refcount = 0;
      return ptr;
    }
    jsonp_free(ptr);
  }
  return (json_t *)0x0;
}

Assistant:

json_t *json_object(void)
{
	json_object_t *object = jsonp_malloc(sizeof(json_object_t));
	if (!object)
		return NULL;

	if (!hashtable_seed) {
		/* Autoseed */
		json_object_seed(0);
	}

	json_init(&object->json, JSON_OBJECT);

	if (hashtable_init(&object->hashtable))
	{
		jsonp_free(object);
		return NULL;
	}

	object->visited = 0;

	return &object->json;
}